

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::Argument_Binding::Clear(Argument_Binding *this)

{
  uint32_t cached_has_bits;
  Argument_Binding *this_local;
  
  clear_binding(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Argument_Binding::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Argument.Binding)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  clear_binding();
  _internal_metadata_.Clear<std::string>();
}